

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseUsingDeclaration(StructuralParser *this)

{
  Expression *args_2;
  ModuleBase *pMVar1;
  Identifier name;
  Context context;
  pool_ref<soul::AST::UsingDeclaration> local_20;
  
  getContext(&context,this);
  name = parseIdentifier(this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275da6);
  args_2 = parseType(this,usingDeclTarget);
  pMVar1 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  local_20.object =
       allocate<soul::AST::UsingDeclaration,soul::AST::Context&,soul::Identifier&,soul::AST::Expression&>
                 (this,&context,&name,args_2);
  std::
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::UsingDeclaration>>
            ((vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>
              *)&pMVar1->usings,&local_20);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2743e3);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&context);
  return;
}

Assistant:

void parseUsingDeclaration()
    {
        auto context = getContext();
        auto name = parseIdentifier();

        expect (Operator::assign);

        auto& type = parseType (ParseTypeContext::usingDeclTarget);
        module->usings.push_back (allocate<AST::UsingDeclaration> (context, name, type));

        expect (Operator::semicolon);
    }